

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_FunImpl2Str(int Type,char *sFI1,char *sFI2,char *str)

{
  char *str_local;
  char *sFI2_local;
  char *sFI1_local;
  int Type_local;
  
  switch(Type) {
  case 0:
    sprintf(str,"(%s&%s)",sFI1,sFI2);
    break;
  case 1:
    sprintf(str,"(~%s&%s)",sFI1,sFI2);
    break;
  case 2:
    sprintf(str,"(%s&~%s)",sFI1,sFI2);
    break;
  case 3:
    sprintf(str,"~(~%s&~%s)",sFI1,sFI2);
    break;
  case 4:
    sprintf(str,"(%s^%s)",sFI1,sFI2);
    break;
  case 5:
    sprintf(str,"~(%s&%s)",sFI1,sFI2);
    break;
  case 6:
    sprintf(str,"~(~%s&%s)",sFI1,sFI2);
    break;
  case 7:
    sprintf(str,"~(%s&~%s)",sFI1,sFI2);
    break;
  case 8:
    sprintf(str,"(~%s&~%s)",sFI1,sFI2);
    break;
  case 9:
    sprintf(str,"~(%s^%s)",sFI1,sFI2);
  }
  return;
}

Assistant:

void Dtt_FunImpl2Str( int Type, char* sFI1, char* sFI2, char* str )
{
    // 0: 1&2, 1: ~1&2, 2: 1&~2, 3: 1|2 = ~(~1&~2), 4: 1^2
    // 5: ~(1&2), 6: ~(~1&2), 7: ~(1&~2), 8: ~1&~2, 9: ~(1^2)
    switch( Type )
    {
        case 0: sprintf( str, "(%s&%s)", sFI1, sFI2 ); break;
        case 1: sprintf( str, "(~%s&%s)", sFI1, sFI2 ); break;
        case 2: sprintf( str, "(%s&~%s)", sFI1, sFI2 ); break;
        case 3: sprintf( str, "~(~%s&~%s)", sFI1, sFI2 ); break;
        case 4: sprintf( str, "(%s^%s)", sFI1, sFI2 ); break;
        case 5: sprintf( str, "~(%s&%s)", sFI1, sFI2 ); break;
        case 6: sprintf( str, "~(~%s&%s)", sFI1, sFI2 ); break;
        case 7: sprintf( str, "~(%s&~%s)", sFI1, sFI2 ); break;
        case 8: sprintf( str, "(~%s&~%s)", sFI1, sFI2 ); break;
        case 9: sprintf( str, "~(%s^%s)", sFI1, sFI2 ); break;
        /*case 0: sprintf( str, " ( %s& %s)", sFI1, sFI2 ); break;
        case 1: sprintf( str, " (~%s& %s)", sFI1, sFI2 ); break;
        case 2: sprintf( str, " ( %s&~%s)", sFI1, sFI2 ); break;
        case 3: sprintf( str, "~(~%s&~%s)", sFI1, sFI2 ); break;
        case 4: sprintf( str, " ( %s^ %s)", sFI1, sFI2 ); break;
        case 5: sprintf( str, "~( %s& %s)", sFI1, sFI2 ); break;
        case 6: sprintf( str, "~(~%s& %s)", sFI1, sFI2 ); break;
        case 7: sprintf( str, "~( %s&~%s)", sFI1, sFI2 ); break;
        case 8: sprintf( str, " (~%s&~%s)", sFI1, sFI2 ); break;
        case 9: sprintf( str, "~( %s^ %s)", sFI1, sFI2 ); break;*/
    }
}